

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_RangeDouble_Test::TestBody(TApp_RangeDouble_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *pOVar3;
  double x;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [16];
  AssertHelper local_a8;
  double local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  string local_70;
  string local_50;
  
  local_a0 = 0.0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--one","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
  this_00 = &(this->super_TApp).app;
  pOVar3 = CLI::App::add_option<double,_(CLI::detail::enabler)0>
                     (this_00,&local_50,&local_a0,&local_70);
  local_98._M_unused._M_object = (void *)0x4008000000000000;
  local_98._8_8_ = 0x4018000000000000;
  pcStack_80 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/Validators.hpp:65:12)>
               ::_M_invoke;
  local_88 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/Validators.hpp:65:12)>
             ::_M_manager;
  std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&pOVar3->validators_,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_c8[0].ptr_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"--one=1","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_c8,
             &local_a8);
  if (local_c8[0].ptr_ != local_b8) {
    operator_delete(local_c8[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4b6,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (local_c8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_c8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8[0].ptr_ + 8))();
    }
    local_c8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_00);
  local_c8[0].ptr_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"--one=7","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_c8,
             &local_a8);
  if (local_c8[0].ptr_ != local_b8) {
    operator_delete(local_c8[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4ba,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (local_c8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_c8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8[0].ptr_ + 8))();
    }
    local_c8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_00);
  local_c8[0].ptr_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"--one=3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_c8,
             &local_a8);
  if (local_c8[0].ptr_ != local_b8) {
    operator_delete(local_c8[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_c8[0].ptr_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"--one=5","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_c8,
             &local_a8);
  if (local_c8[0].ptr_ != local_b8) {
    operator_delete(local_c8[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_c8[0].ptr_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"--one=6","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_c8,
             &local_a8);
  if (local_c8[0].ptr_ != local_b8) {
    operator_delete(local_c8[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RangeDouble) {

    double x = 0;
    /// Note that this must be a double in Range, too
    app.add_option("--one", x)->check(CLI::Range(3.0, 6.0));

    args = {"--one=1"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=7"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=3"};
    run();

    app.reset();
    args = {"--one=5"};
    run();

    app.reset();
    args = {"--one=6"};
    run();
}